

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O3

void __thiscall re2c::dfa_t::dfa_t(dfa_t *this,nfa_t *nfa,charset_t *charset,rules_t *rules)

{
  pointer *pppdVar1;
  vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>> *pvVar2;
  int iVar3;
  iterator __position;
  int *piVar4;
  iterator __position_00;
  dfa_state_t *pdVar5;
  RuleOp *pRVar6;
  rules_t *prVar7;
  long lVar8;
  rules_t *this_00;
  bool bVar9;
  nfa_state_t **end;
  pointer puVar10;
  _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
  *this_01;
  size_t *psVar11;
  nfa_state_t **ppnVar12;
  size_t sVar13;
  mapped_type *pmVar14;
  _Rb_tree_node_base *p_Var15;
  mapped_type *pmVar16;
  uint uVar17;
  pointer *pppnVar18;
  key_type_conflict kVar19;
  long lVar20;
  elem_t *peVar21;
  size_type __n;
  ulong uVar22;
  _Rb_tree_header *p_Var23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  pointer ppnVar28;
  long *plVar29;
  dfa_state_t *s;
  nfa_state_t *m;
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  arcs;
  ord_hash_set_t kernels;
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  s2rules;
  key_type_conflict local_100;
  dfa_t *local_f8;
  nfa_state_t **local_f0;
  dfa_state_t *local_e8;
  nfa_state_t *local_e0;
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  local_d8;
  rules_t *local_c0;
  ulong local_b8;
  elem_t *local_b0;
  ord_hash_set_t local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  local_60;
  
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) - 1;
  this->nchars = __n;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.lookup._M_t._M_impl._0_8_ = 0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = this;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = (nfa_state_t **)operator_new__((ulong)nfa->size << 3);
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::vector(&local_d8,__n,(allocator_type *)&local_100);
  ppnVar12 = local_f0;
  end = closure(local_f0,nfa->root);
  find_state(ppnVar12,end,&local_a8);
  local_100 = 0;
  local_c0 = rules;
  if (local_a8.elems.
      super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.elems.
      super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      kVar19 = local_100;
      local_e8 = (dfa_state_t *)operator_new(0x18);
      local_e8->arcs = (size_t *)0x0;
      local_e8->rule = (RuleOp *)0x0;
      local_e8->ctx = false;
      __position._M_current =
           (local_f8->states).
           super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_f8->states).
          super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<re2c::dfa_state_t*,std::allocator<re2c::dfa_state_t*>>::
        _M_realloc_insert<re2c::dfa_state_t*const&>
                  ((vector<re2c::dfa_state_t*,std::allocator<re2c::dfa_state_t*>> *)local_f8,
                   __position,&local_e8);
        kVar19 = local_100;
      }
      else {
        *__position._M_current = local_e8;
        pppdVar1 = &(local_f8->states).
                    super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppdVar1 = *pppdVar1 + 1;
      }
      peVar21 = local_a8.elems.
                super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                ._M_impl.super__Vector_impl_data._M_start[kVar19];
      if (7 < peVar21->size) {
        uVar24 = peVar21->size >> 3;
        uVar22 = 0;
        local_b8 = uVar24;
        local_b0 = peVar21;
        do {
          piVar4 = *(int **)(peVar21->data + uVar22 * 8);
          iVar3 = *piVar4;
          if (iVar3 == 3) {
            this_01 = (_Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
                       *)std::
                         map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                         ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                                       *)&local_60,&local_100);
            std::
            _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
            ::_M_insert_unique<re2c::RuleOp*const&>(this_01,(RuleOp **)(piVar4 + 2));
          }
          else if (iVar3 == 2) {
            local_e8->ctx = true;
          }
          else if (iVar3 == 1) {
            local_e0 = *(nfa_state_t **)(piVar4 + 2);
            plVar29 = *(long **)(piVar4 + 4);
            peVar21 = local_b0;
            uVar24 = local_b8;
            if (plVar29 != (long *)0x0) {
              puVar10 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              lVar26 = 0;
              do {
                lVar27 = lVar26 * 0x18;
                lVar25 = lVar26 + -1;
                do {
                  lVar20 = lVar27;
                  lVar26 = lVar25 + 1;
                  lVar8 = lVar25 + 1;
                  lVar27 = lVar20 + 0x18;
                  lVar25 = lVar26;
                } while (puVar10[lVar8] != *(uint *)(plVar29 + 1));
                uVar17 = *(uint *)((long)plVar29 + 0xc);
                lVar27 = lVar26;
                if (*(uint *)(plVar29 + 1) != uVar17) {
                  do {
                    pvVar2 = (vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>> *)
                             ((long)&((local_d8.
                                       super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar20);
                    __position_00._M_current =
                         *(nfa_state_t ***)
                          ((long)&((local_d8.
                                    super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + lVar20);
                    if (__position_00._M_current ==
                        *(nfa_state_t ***)
                         ((long)&((local_d8.
                                   super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20)) {
                      std::vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>>::
                      _M_realloc_insert<re2c::nfa_state_t*const&>(pvVar2,__position_00,&local_e0);
                      uVar17 = *(uint *)((long)plVar29 + 0xc);
                    }
                    else {
                      *__position_00._M_current = local_e0;
                      pvVar2 = pvVar2 + 8;
                      *(long *)pvVar2 = *(long *)pvVar2 + 8;
                    }
                    lVar26 = lVar27 + 1;
                    puVar10 = (charset->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    lVar20 = lVar20 + 0x18;
                    lVar25 = lVar27 + 1;
                    lVar27 = lVar26;
                  } while (puVar10[lVar25] != uVar17);
                }
                plVar29 = (long *)*plVar29;
                peVar21 = local_b0;
                uVar24 = local_b8;
              } while (plVar29 != (long *)0x0);
            }
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar24);
      }
      uVar24 = local_f8->nchars;
      psVar11 = (size_t *)operator_new__(-(ulong)(uVar24 >> 0x3d != 0) | uVar24 * 8);
      local_e8->arcs = psVar11;
      if (uVar24 != 0) {
        uVar24 = 0;
        do {
          ppnVar12 = local_f0;
          for (ppnVar28 = local_d8.
                          super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar24].
                          super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppnVar28 !=
              local_d8.
              super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar24].
              super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppnVar28 = ppnVar28 + 1) {
            ppnVar12 = closure(ppnVar12,*ppnVar28);
          }
          sVar13 = find_state(local_f0,ppnVar12,&local_a8);
          local_e8->arcs[uVar24] = sVar13;
          uVar24 = uVar24 + 1;
          uVar22 = local_f8->nchars;
        } while (uVar24 < uVar22);
        if (uVar22 != 0) {
          pppnVar18 = &((local_d8.
                         super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (*pppnVar18 != ((_Vector_impl_data *)(pppnVar18 + -1))->_M_start) {
              *pppnVar18 = ((_Vector_impl_data *)(pppnVar18 + -1))->_M_start;
            }
            pppnVar18 = pppnVar18 + 3;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
      }
      local_100 = local_100 + 1;
    } while (local_100 <
             (ulong)((long)local_a8.elems.
                           super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a8.elems.
                           super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  operator_delete__(local_f0);
  local_100 = 0;
  lVar26 = (long)(local_f8->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_f8->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar26 != 0) {
    do {
      pdVar5 = (local_f8->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start[local_100];
      pmVar14 = std::
                map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                              *)&local_60,&local_100);
      p_Var15 = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var23 = &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
      prVar7 = local_c0;
      if ((_Rb_tree_header *)p_Var15 != p_Var23) {
        do {
          pRVar6 = *(RuleOp **)(p_Var15 + 1);
          if ((pdVar5->rule == (RuleOp *)0x0) ||
             (bVar9 = rule_rank_t::operator<(&pRVar6->rank,&pdVar5->rule->rank), bVar9)) {
            pdVar5->rule = pRVar6;
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var23);
        p_Var15 = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        prVar7 = local_c0;
      }
      while (this_00 = local_c0, local_c0 = prVar7, (_Rb_tree_header *)p_Var15 != p_Var23) {
        if (pdVar5->rule != *(RuleOp **)(p_Var15 + 1)) {
          pmVar16 = std::
                    map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                    ::operator[](this_00,&(*(RuleOp **)(p_Var15 + 1))->rank);
          std::
          _Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
          ::_M_insert_unique<re2c::rule_rank_t_const&>
                    ((_Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
                      *)&pmVar16->shadow,&pdVar5->rule->rank);
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        prVar7 = local_c0;
        local_c0 = this_00;
      }
      local_100 = local_100 + 1;
    } while (local_100 < (ulong)(lVar26 >> 3));
  }
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::~vector(&local_d8);
  ord_hash_set_t::~ord_hash_set_t(&local_a8);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

dfa_t::dfa_t(const nfa_t &nfa, const charset_t &charset, rules_t &rules)
	: states()
	, nchars(charset.size() - 1) // (n + 1) bounds for n ranges
{
	std::map<size_t, std::set<RuleOp*> > s2rules;
	ord_hash_set_t kernels;
	nfa_state_t **const buffer = new nfa_state_t*[nfa.size];
	std::vector<std::vector<nfa_state_t*> > arcs(nchars);

	find_state(buffer, closure(buffer, nfa.root), kernels);
	for (size_t i = 0; i < kernels.size(); ++i)
	{
		dfa_state_t *s = new dfa_state_t;
		states.push_back(s);

		nfa_state_t **kernel;
		const size_t kernel_size = kernels.deref<nfa_state_t*>(i, kernel);
		for (size_t j = 0; j < kernel_size; ++j)
		{
			nfa_state_t *n = kernel[j];
			switch (n->type)
			{
				case nfa_state_t::RAN:
				{
					nfa_state_t *m = n->value.ran.out;
					size_t c = 0;
					for (Range *r = n->value.ran.ran; r; r = r->next ())
					{
						for (; charset[c] != r->lower(); ++c);
						for (; charset[c] != r->upper(); ++c)
						{
							arcs[c].push_back(m);
						}
					}
					break;
				}
				case nfa_state_t::CTX:
					s->ctx = true;
					break;
				case nfa_state_t::FIN:
					s2rules[i].insert(n->value.fin.rule);
					break;
				default:
					break;
			}
		}

		s->arcs = new size_t[nchars];
		for(size_t c = 0; c < nchars; ++c)
		{
			nfa_state_t **end = buffer;
			for (std::vector<nfa_state_t*>::const_iterator j = arcs[c].begin(); j != arcs[c].end(); ++j)
			{
				end = closure(end, *j);
			}
			s->arcs[c] = find_state(buffer, end, kernels);
		}

		for(size_t c = 0; c < nchars; ++c)
		{
			arcs[c].clear();
		}
	}
	delete[] buffer;

	const size_t count = states.size();
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = states[i];
		std::set<RuleOp*> &rs = s2rules[i];
		// for each final state: choose the rule with the smallest rank
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (!s->rule || rule->rank < s->rule->rank)
			{
				s->rule = rule;
			}
		}
		// other rules are shadowed by the chosen rule
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (s->rule != rule)
			{
				rules[rule->rank].shadow.insert(s->rule->rank);
			}
		}
	}
}